

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O2

void ggml_compute_forward_mean(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_tensor *pgVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  int64_t i02;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  
  pgVar1 = dst->src[0];
  if (pgVar1->type == GGML_TYPE_F32) {
    if (params->ith == 0) {
      lVar20 = 0;
      lVar17 = 0;
      sVar2 = pgVar1->nb[1];
      sVar3 = pgVar1->nb[2];
      lVar4 = pgVar1->ne[0];
      uVar5 = pgVar1->ne[1];
      sVar6 = pgVar1->nb[3];
      uVar7 = pgVar1->ne[2];
      uVar8 = pgVar1->ne[3];
      sVar9 = dst->nb[1];
      sVar10 = dst->nb[2];
      sVar11 = dst->nb[3];
      for (uVar12 = 0; uVar12 != (~((long)uVar8 >> 0x3f) & uVar8); uVar12 = uVar12 + 1) {
        uVar13 = 0;
        lVar16 = lVar17;
        lVar19 = lVar20;
        while( true ) {
          uVar14 = ~((long)uVar5 >> 0x3f) & uVar5;
          lVar15 = lVar16;
          lVar18 = lVar19;
          if (uVar13 == (~((long)uVar7 >> 0x3f) & uVar7)) break;
          while (bVar21 = uVar14 != 0, uVar14 = uVar14 - 1, bVar21) {
            ggml_vec_sum_f32((int)lVar4,(float *)((long)dst->data + lVar18),
                             (float *)((long)pgVar1->data + lVar15));
            lVar15 = lVar15 + sVar2;
            *(float *)((long)dst->data + lVar18) =
                 *(float *)((long)dst->data + lVar18) / (float)lVar4;
            lVar18 = lVar18 + sVar9;
          }
          uVar13 = uVar13 + 1;
          lVar16 = lVar16 + sVar3;
          lVar19 = lVar19 + sVar10;
        }
        lVar17 = lVar17 + sVar6;
        lVar20 = lVar20 + sVar11;
      }
    }
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
             ,0x818,"fatal error");
}

Assistant:

void ggml_compute_forward_mean(
        const ggml_compute_params * params,
        ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_mean_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}